

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O2

void __thiscall
slang::analysis::AnalysisScopeVisitor::checkValueUnused
          (AnalysisScopeVisitor *this,ValueSymbol *symbol,DiagCode unusedCode,
          optional<slang::DiagCode> unsetCode,optional<slang::DiagCode> unreadCode)

{
  SyntaxNode *node;
  PortBackref *pPVar1;
  pair<bool,_bool> pVar2;
  byte bVar3;
  pair<bool,_bool> pVar4;
  
  if (((this->manager->options).flags.m_bits & 1) == 0) {
    return;
  }
  node = (symbol->super_Symbol).originatingSyntax;
  if (node == (SyntaxNode *)0x0) {
    return;
  }
  if ((symbol->super_Symbol).name._M_len == 0) {
    return;
  }
  pVar4 = isReferenced(this,node);
  pVar2 = (pair<bool,_bool>)((ushort)pVar4 >> 8);
  bVar3 = pVar4.second;
  pPVar1 = symbol->firstPortBackref;
  if (pPVar1 == (PortBackref *)0x0) {
    if (((ushort)pVar4 & 1) == 0) {
      if (((ushort)pVar2 & 1) == 0) goto LAB_0028bb99;
      bVar3 = 1;
      unusedCode = unreadCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                   super__Optional_payload_base<slang::DiagCode>._M_payload;
      if (((uint6)unreadCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::DiagCode> & 0x100000000) != 0)
      goto LAB_0028bb99;
    }
    unusedCode = unsetCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::DiagCode>._M_payload;
    if ((((uint6)unsetCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::DiagCode> & 0x100000000) == 0 ||
        (symbol->declaredType).initializerSyntax != (ExpressionSyntax *)0x0) || (bVar3 & 1) != 0) {
      return;
    }
  }
  else {
    if (pPVar1->next != (PortBackref *)0x0) {
      return;
    }
    switch(((pPVar1->port).ptr)->direction) {
    case In:
      unusedCode = (DiagCode)0x26000e;
      pVar2 = pVar4;
      break;
    case InOut:
      if (((ushort)pVar4 & 1) == 0) {
        unusedCode = (DiagCode)(((byte)~bVar3 & 1) * 0x80000 + 0x1e000e);
        goto LAB_0028bb99;
      }
    case Out:
      unusedCode = (DiagCode)0x1a000e;
      break;
    case Ref:
      if (((ushort)pVar4 & 1) != 0) {
        return;
      }
      unusedCode = (DiagCode)0x26000e;
      break;
    default:
      goto switchD_0028bb1d_default;
    }
    if (((ushort)pVar2 & 1) != 0) {
switchD_0028bb1d_default:
      return;
    }
  }
LAB_0028bb99:
  addDiag(this,&symbol->super_Symbol,unusedCode);
  return;
}

Assistant:

void checkValueUnused(const ValueSymbol& symbol, DiagCode unusedCode,
                          std::optional<DiagCode> unsetCode, std::optional<DiagCode> unreadCode) {
        if (!manager.hasFlag(AnalysisFlags::CheckUnused))
            return;

        auto syntax = symbol.getSyntax();
        if (!syntax || symbol.name.empty())
            return;

        auto [rvalue, lvalue] = isReferenced(*syntax);

        auto portRef = symbol.getFirstPortBackref();
        if (portRef) {
            // This is a variable or net connected internally to a port.
            // If there is more than one port connection something unusually
            // complicated is going on so don't try to diagnose warnings.
            if (portRef->getNextBackreference())
                return;

            // Otherwise check and warn about the port being unused.
            switch (portRef->port->direction) {
                case ArgumentDirection::In:
                    if (!rvalue)
                        addDiag(symbol, diag::UnusedPort);
                    break;
                case ArgumentDirection::Out:
                    if (!lvalue)
                        addDiag(symbol, diag::UndrivenPort);
                    break;
                case ArgumentDirection::InOut:
                    if (!rvalue && !lvalue)
                        addDiag(symbol, diag::UnusedPort);
                    else if (!rvalue)
                        addDiag(symbol, diag::UnusedButSetPort);
                    else if (!lvalue)
                        addDiag(symbol, diag::UndrivenPort);
                    break;
                case ArgumentDirection::Ref:
                    if (!rvalue && !lvalue)
                        addDiag(symbol, diag::UnusedPort);
                    break;
            }
            return;
        }

        if (!rvalue && !lvalue)
            addDiag(symbol, unusedCode);
        else if (!rvalue && unreadCode)
            addDiag(symbol, *unreadCode);
        else if (!lvalue && !symbol.getDeclaredType()->getInitializerSyntax() && unsetCode)
            addDiag(symbol, *unsetCode);
    }